

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

void fs_event_create_files(uv_timer_t *handle)

{
  int iVar1;
  uv_loop_t *loop;
  int iVar2;
  int extraout_EDX;
  char *unaff_RBX;
  char *__s1;
  long *path;
  uv_fs_event_t *puVar3;
  uv_handle_t *handle_00;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_230 [32];
  uv_fs_t uStack_210;
  uv_loop_t *puStack_50;
  long lStack_38;
  char *pcStack_30;
  
  if (fs_event_created < 0x10) {
    unaff_RBX = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_30 = unaff_RBX;
  loop = uv_default_loop();
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");
  iVar1 = uv_fs_event_init(loop,&fs_event);
  lStack_38 = (long)iVar1;
  if (lStack_38 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    lStack_38 = (long)iVar1;
    if (lStack_38 != 0) goto LAB_0018462c;
    iVar1 = uv_timer_init(loop,&timer);
    lStack_38 = (long)iVar1;
    if (lStack_38 != 0) goto LAB_00184639;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    lStack_38 = (long)iVar1;
    if (lStack_38 != 0) goto LAB_00184646;
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_38 = 1;
    if (fs_event_cb_called != 1) goto LAB_00184653;
    lStack_38 = 2;
    if (timer_cb_called != 2) goto LAB_00184660;
    lStack_38 = 2;
    if (close_cb_called != 2) goto LAB_0018466d;
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    uv_walk(loop,close_walk_cb,(void *)0x0);
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_38 = 0;
    iVar1 = uv_loop_close(loop);
    if (lStack_38 == iVar1) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_event_watch_file_cold_1();
LAB_0018462c:
    run_test_fs_event_watch_file_cold_2();
LAB_00184639:
    run_test_fs_event_watch_file_cold_3();
LAB_00184646:
    run_test_fs_event_watch_file_cold_4();
LAB_00184653:
    run_test_fs_event_watch_file_cold_5();
LAB_00184660:
    run_test_fs_event_watch_file_cold_6();
LAB_0018466d:
    run_test_fs_event_watch_file_cold_7();
  }
  path = &lStack_38;
  run_test_fs_event_watch_file_cold_8();
  iVar2 = 0x41;
  auStack_230._0_8_ = (void *)0x1846ad;
  puStack_50 = loop;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_230 + 0x20),(char *)path,0x41,0x180,
                     (uv_fs_cb)0x0);
  auStack_230._24_8_ = SEXT48(iVar1);
  auStack_230._16_8_ = 0;
  if ((uv_close_cb)auStack_230._24_8_ == (uv_close_cb)0x0) {
    auStack_230._0_8_ = (void *)0x1846d9;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_230 + 0x20));
    iVar2 = 0;
    auStack_230._0_8_ = (void *)0x1846e7;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_230 + 0x20),
                        (uv_os_fd_t)uStack_210.result,(uv_fs_cb)0x0);
    auStack_230._24_8_ = SEXT48(iVar1);
    auStack_230._16_8_ = 0;
    if ((uv_close_cb)auStack_230._24_8_ == (uv_close_cb)0x0) {
      auStack_230._0_8_ = (void *)0x18470d;
      uv_fs_req_cleanup((uv_fs_t *)(auStack_230 + 0x20));
      return;
    }
  }
  else {
    auStack_230._0_8_ = (void *)0x184726;
    create_file_cold_1();
  }
  puVar3 = (uv_fs_event_t *)(auStack_230 + 0x18);
  __s1 = auStack_230 + 0x10;
  auStack_230._0_8_ = fs_event_cb_file;
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar3 == &fs_event) {
    auStack_230._0_8_ = SEXT48(iVar2);
    if ((code *)auStack_230._0_8_ != (code *)0x0) goto LAB_00184803;
    auStack_230._0_8_ = SEXT48(extraout_EDX);
    if ((code *)auStack_230._0_8_ != (code *)0x2) goto LAB_00184812;
    iVar1 = strcmp(__s1,"file2");
    auStack_230._0_8_ = SEXT48(iVar1);
    if ((code *)auStack_230._0_8_ == (code *)0x0) {
      iVar1 = uv_fs_event_stop(&fs_event);
      auStack_230._0_8_ = SEXT48(iVar1);
      if ((code *)auStack_230._0_8_ == (code *)0x0) {
        uv_close((uv_handle_t *)&fs_event,close_cb);
        return;
      }
      goto LAB_00184830;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_00184803:
    fs_event_cb_file_cold_2();
LAB_00184812:
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00184830:
  handle_00 = (uv_handle_t *)auStack_230;
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  uv_close(handle_00,close_cb);
  return;
}

Assistant:

static void fs_event_create_files(uv_timer_t* handle) {
  /* Make sure we're not attempting to create files we do not intend */
  ASSERT_LT(fs_event_created, fs_event_file_count);

  /* Create the file */
  create_file(fs_event_get_filename(fs_event_created));

  if (++fs_event_created < fs_event_file_count) {
    /* Create another file on a different event loop tick.  We do it this way
     * to avoid fs events coalescing into one fs event. */
    ASSERT_OK(uv_timer_start(&timer, fs_event_create_files, 100, 0));
  }
}